

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O3

index_t get_next_vertex(index_t *v,index_t idx,index_t k,binomial_coeff_table *binomial_coeff)

{
  pointer pvVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = *v;
  uVar3 = (ulong)iVar5;
  pvVar1 = (binomial_coeff->B).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(int *)(*(long *)&pvVar1[uVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl +
              (long)k * 4) <= idx || (long)uVar3 < 1) {
    return iVar5;
  }
  do {
    iVar2 = (int)uVar3;
    uVar3 = uVar3 >> 1 & 0x7fffffff;
    iVar4 = iVar5 - (uint)uVar3;
    if (idx < *(int *)(*(long *)&pvVar1[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl
                      + (long)k * 4)) {
      iVar5 = iVar4 + -1;
      *v = iVar5;
      uVar3 = (ulong)(~(uint)uVar3 + iVar2);
    }
  } while (0 < (int)uVar3);
  return iVar5;
}

Assistant:

index_t get_next_vertex(index_t& v, const index_t idx, const index_t k, const binomial_coeff_table& binomial_coeff) {
	if (binomial_coeff(v, k) > idx) {
		index_t count = v;
		while (count > 0) {
			index_t i = v;
			index_t step = count >> 1;
			i -= step;
			if (binomial_coeff(i, k) > idx) {
				v = --i;
				count -= step + 1;
			} else
				count = step;
		}
	}
	assert(binomial_coeff(v, k) <= idx);
	assert(binomial_coeff(v + 1, k) > idx);
	return v;
}